

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void __thiscall lda::expdigammify(lda *this,vw *all,float *gamma)

{
  lda_math_mode lVar1;
  ostream *this_00;
  vw *in_RDX;
  float *in_RSI;
  lda *in_RDI;
  undefined8 in_stack_ffffffffffffffb0;
  float *in_stack_ffffffffffffffb8;
  vw *in_stack_ffffffffffffffc0;
  
  lVar1 = in_RDI->mmode;
  if (lVar1 == USE_SIMD) {
    underflow_threshold(in_RDI);
    ldamath::expdigammify<float,(lda_math_mode)0>(in_RDX,in_RSI,0.0,3.954953e-39);
  }
  else if (lVar1 == USE_PRECISE) {
    underflow_threshold(in_RDI);
    ldamath::expdigammify<float,(lda_math_mode)1>
              (in_RDX,in_RSI,(float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               (float)in_stack_ffffffffffffffb0);
  }
  else {
    if (lVar1 != USE_FAST_APPROX) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "lda::expdigammify: Trampled or invalid math mode, aborting");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      abort();
    }
    underflow_threshold(in_RDI);
    ldamath::expdigammify<float,(lda_math_mode)2>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(float)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void lda::expdigammify(vw &all, float *gamma)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      ldamath::expdigammify<float, USE_FAST_APPROX>(all, gamma, underflow_threshold(), 0.0f);
      break;
    case USE_PRECISE:
      ldamath::expdigammify<float, USE_PRECISE>(all, gamma, underflow_threshold(), 0.0f);
      break;
    case USE_SIMD:
      ldamath::expdigammify<float, USE_SIMD>(all, gamma, underflow_threshold(), 0.0f);
      break;
    default:
      std::cerr << "lda::expdigammify: Trampled or invalid math mode, aborting" << std::endl;
      abort();
  }
}